

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O3

char * customgetcwd(char *buf,size_t size)

{
  char *pcVar1;
  
  if (customgetcwd::real_getcwd == '\0') {
    customgetcwd_cold_1();
  }
  if (buf == (char *)0x0) {
    if (size == 0) {
      size = 0x1000;
    }
    buf = (char *)xxmalloc(size);
  }
  pcVar1 = (*customgetcwd::real_getcwd)(buf,size);
  return pcVar1;
}

Assistant:

char * MYCDECL CUSTOM_GETCWD(char * buf, size_t size)
{
  static getcwdFunction * real_getcwd
    = reinterpret_cast<getcwdFunction *>
    (reinterpret_cast<uintptr_t>(dlsym (RTLD_NEXT, "getcwd")));

  if (!buf) {
    if (size == 0) {
      size = PATH_MAX;
    }
    buf = (char *) xxmalloc(size);
  }
  return (real_getcwd)(buf, size);
}